

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

bool AppInitLockDataDirectory(void)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  bool in_stack_0000003e;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = LockDataDirectory(in_stack_0000003e);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool AppInitLockDataDirectory()
{
    // After daemonization get the data directory lock again and hold on to it until exit
    // This creates a slight window for a race condition to happen, however this condition is harmless: it
    // will at most make us exit without printing a message to console.
    if (!LockDataDirectory(false)) {
        // Detailed error printed inside LockDataDirectory
        return false;
    }
    return true;
}